

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

double3 * tinyusdz::geometric_normal
                    (double3 *__return_storage_ptr__,double3 *p0,double3 *p1,double3 *p2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double3 n;
  double3 local_28;
  
  dVar1 = p1->_M_elems[0] - p0->_M_elems[0];
  dVar3 = p1->_M_elems[1] - p0->_M_elems[1];
  dVar4 = p1->_M_elems[2] - p0->_M_elems[2];
  dVar2 = p2->_M_elems[1] - p0->_M_elems[1];
  dVar5 = p2->_M_elems[2] - p0->_M_elems[2];
  dVar6 = p2->_M_elems[0] - p0->_M_elems[0];
  local_28._M_elems[0] = dVar3 * dVar5 - dVar2 * dVar4;
  local_28._M_elems[1] = dVar4 * dVar6 - dVar5 * dVar1;
  local_28._M_elems[2] = dVar1 * dVar2 - dVar6 * dVar3;
  vnormalize(__return_storage_ptr__,&local_28,2.220446049250313e-16);
  return __return_storage_ptr__;
}

Assistant:

value::double3 geometric_normal(const value::double3 &p0, const value::double3 &p1, const value::double3 &p2)
{
  value::double3 n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}